

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestReservedWords::Run(ParserTestReservedWords *this)

{
  int iVar1;
  int iVar2;
  int fail_count;
  ParserTestReservedWords *this_local;
  
  iVar1 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule build\n  command = rule run $out\nbuild subninja: build include default foo.cc\ndefault subninja\n"
            );
  iVar2 = testing::Test::AssertionFailures(g_current_test);
  if (iVar1 != iVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, ReservedWords) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule build\n"
"  command = rule run $out\n"
"build subninja: build include default foo.cc\n"
"default subninja\n"));
}